

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_task.cpp
# Opt level: O0

MPP_RET hal_task_hnd_set_status(HalTaskHnd hnd,RK_S32 status)

{
  long lVar1;
  HalTaskGroupImpl *group;
  HalTaskImpl *impl;
  RK_S32 status_local;
  HalTaskHnd hnd_local;
  
  if ((hnd == (HalTaskHnd)0x0) || (2 < status)) {
    _mpp_log_l(2,"hal_task","found invaid input hnd %p status %d\n","hal_task_hnd_set_status",hnd,
               (ulong)(uint)status);
    hnd_local._4_4_ = MPP_ERR_UNKNOW;
  }
  else {
    lVar1 = *(long *)((long)hnd + 0x10);
    if ((lVar1 == 0) &&
       (_mpp_log_l(2,"hal_task","Assertion %s failed at %s:%d\n",(char *)0x0,"group",
                   "hal_task_hnd_set_status",0xbd), (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    if ((*(int *)(lVar1 + 4) <= *(int *)((long)hnd + 0x18)) &&
       (_mpp_log_l(2,"hal_task","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "impl->index < group->task_count","hal_task_hnd_set_status",0xbe),
       (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    mpp_spinlock_lock((spinlock_t *)(lVar1 + 8));
    list_del_init((list_head *)hnd);
    list_add_tail((list_head *)hnd,(list_head *)(*(long *)(lVar1 + 0x28) + (long)status * 0x10));
    *(int *)(*(long *)(lVar1 + 0x30) + (long)*(int *)((long)hnd + 0x1c) * 4) =
         *(int *)(*(long *)(lVar1 + 0x30) + (long)*(int *)((long)hnd + 0x1c) * 4) + -1;
    *(int *)(*(long *)(lVar1 + 0x30) + (long)status * 4) =
         *(int *)(*(long *)(lVar1 + 0x30) + (long)status * 4) + 1;
    *(RK_S32 *)((long)hnd + 0x1c) = status;
    mpp_spinlock_unlock((spinlock_t *)(lVar1 + 8));
    hnd_local._4_4_ = MPP_OK;
  }
  return hnd_local._4_4_;
}

Assistant:

MPP_RET hal_task_hnd_set_status(HalTaskHnd hnd, RK_S32 status)
{
    if (NULL == hnd || status >= TASK_BUTT) {
        mpp_err_f("found invaid input hnd %p status %d\n", hnd, status);
        return MPP_ERR_UNKNOW;
    }

    HalTaskImpl *impl = (HalTaskImpl *)hnd;
    HalTaskGroupImpl *group = impl->group;

    mpp_assert(group);
    mpp_assert(impl->index < group->task_count);

    mpp_spinlock_lock(&group->lock);
    list_del_init(&impl->list);
    list_add_tail(&impl->list, &group->list[status]);
    group->count[impl->status]--;
    group->count[status]++;
    impl->status = status;
    mpp_spinlock_unlock(&group->lock);

    return MPP_OK;
}